

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

void increment_index(void)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)argv_index;
  if (argv_index < argv_index2) {
    do {
      argv_index = argv_index + 1;
      lVar1 = lVar2 + 1;
      if (prev_argv[lVar1] == (char *)0x0) {
        opt_offset = 1;
        return;
      }
      if (argv_index2 <= lVar2) {
        opt_offset = 1;
        return;
      }
      lVar2 = lVar2 + 1;
    } while (*prev_argv[lVar1] != '-');
  }
  else {
    argv_index = argv_index + 1;
  }
  opt_offset = 1;
  return;
}

Assistant:

static void increment_index()
{
	/* Move onto the next option */
	if(argv_index < argv_index2)
	{
		while(prev_argv[++argv_index] && prev_argv[argv_index][0] != '-'
				&& argv_index < argv_index2+1);
	}
	else argv_index++;
	opt_offset = 1;
}